

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O1

void __thiscall ser::CentralizedFileFormat::CleanTables(CentralizedFileFormat *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  ostream *poVar3;
  ostringstream fname;
  char *local_1c8;
  char local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (*(this->super_FileFormat)._vptr_FileFormat[3])();
  cVar1 = FieldsTable::begin_abi_cxx11_((this->super_FileFormat).pFieldsTable_);
  cVar2 = FieldsTable::end_abi_cxx11_((this->super_FileFormat).pFieldsTable_);
  if (cVar1._M_node != cVar2._M_node) {
    do {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->super_FileFormat).directory_._M_dataplus._M_p,
                          (this->super_FileFormat).directory_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(this->super_FileFormat).prefix_._M_dataplus._M_p,
                          (this->super_FileFormat).prefix_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)(cVar1._M_node + 2),(long)cVar1._M_node[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
      std::__cxx11::stringbuf::str();
      remove(local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node);
      cVar2 = FieldsTable::end_abi_cxx11_((this->super_FileFormat).pFieldsTable_);
    } while (cVar1._M_node != cVar2._M_node);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->super_FileFormat).directory_._M_dataplus._M_p,
                      (this->super_FileFormat).directory_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(this->super_FileFormat).prefix_._M_dataplus._M_p,
                      (this->super_FileFormat).prefix_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".dat",4);
  std::__cxx11::stringbuf::str();
  remove(local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  MetainfoSet::Cleanup((this->super_FileFormat).pGlobalMetainfo_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
           *)(this->super_FileFormat).pFieldsTable_);
  OffsetTable::Cleanup((this->super_FileFormat).pOffsetTable_);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CentralizedFileFormat::CleanTables()
{
    // Import tables to get list of files
    ImportTables();

    // Remove data files
    for (FieldsTable::const_iterator iter = pFieldsTable_->begin(); iter != pFieldsTable_->end(); ++iter)
    {
        std::ostringstream fname;
        fname << directory_ << "/" << prefix_ << "_" << iter->second.name() << ".dat";
        std::remove(fname.str().c_str());
    }

    // Remove database file
    std::ostringstream fname;
    fname << directory_ << "/" << prefix_ << ".dat";
    std::remove(fname.str().c_str());

    // Clean tables
    pGlobalMetainfo_->Cleanup();
    pFieldsTable_->Cleanup();
    pOffsetTable_->Cleanup();
}